

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegCompactPushString(xmlRegExecCtxtPtr exec,xmlRegexpPtr comp,xmlChar *value,void *data)

{
  int iVar1;
  int iVar2;
  xmlChar **ppxVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlChar *pxVar7;
  int *piVar8;
  ulong uVar9;
  
  uVar6 = 0xffffffff;
  if (((comp != (xmlRegexpPtr)0x0) &&
      (piVar8 = comp->compact, uVar6 = 0xffffffff, piVar8 != (int *)0x0)) &&
     (ppxVar3 = comp->stringMap, ppxVar3 != (xmlChar **)0x0)) {
    iVar1 = exec->index;
    uVar6 = comp->nbstrings;
    if (value == (xmlChar *)0x0) {
      uVar6 = (uint)(piVar8[(int)((uVar6 + 1) * iVar1)] == 2);
    }
    else {
      if (0 < (int)uVar6) {
        iVar4 = uVar6 + 1;
        uVar9 = 0;
        do {
          iVar2 = piVar8[(long)(iVar4 * iVar1) + uVar9 + 1];
          if (((0 < iVar2) && (iVar2 <= comp->nbstates)) &&
             (iVar5 = xmlRegStrEqualWildcard(ppxVar3[uVar9],value), iVar5 != 0)) {
            exec->index = iVar2 + -1;
            if ((exec->callback != (xmlRegExecCallbacks)0x0) && (comp->transdata != (void **)0x0)) {
              (*exec->callback)((xmlRegExecCtxtPtr)exec->data,value,
                                comp->transdata[(int)((int)uVar9 + uVar6 * iVar1)],data);
              piVar8 = comp->compact;
              iVar4 = comp->nbstrings + 1;
            }
            if (piVar8[iVar4 * (iVar2 + -1)] == 2) {
              return 1;
            }
            if (piVar8[iVar4 * (iVar2 + -1)] != 4) {
              return 0;
            }
            break;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      exec->errStateNo = iVar1;
      exec->status = -1;
      if (exec->errString != (xmlChar *)0x0) {
        (*xmlFree)(exec->errString);
      }
      pxVar7 = xmlStrdup(value);
      exec->errString = pxVar7;
      if (pxVar7 == (xmlChar *)0x0) {
        exec->status = -5;
        uVar6 = 0xfffffffb;
      }
      else {
        uVar6 = exec->status;
      }
    }
  }
  return uVar6;
}

Assistant:

static int
xmlRegCompactPushString(xmlRegExecCtxtPtr exec,
	                xmlRegexpPtr comp,
	                const xmlChar *value,
	                void *data) {
    int state = exec->index;
    int i, target;

    if ((comp == NULL) || (comp->compact == NULL) || (comp->stringMap == NULL))
	return(-1);

    if (value == NULL) {
	/*
	 * are we at a final state ?
	 */
	if (comp->compact[state * (comp->nbstrings + 1)] ==
            XML_REGEXP_FINAL_STATE)
	    return(1);
	return(0);
    }

    /*
     * Examine all outside transitions from current state
     */
    for (i = 0;i < comp->nbstrings;i++) {
	target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	if ((target > 0) && (target <= comp->nbstates)) {
	    target--; /* to avoid 0 */
	    if (xmlRegStrEqualWildcard(comp->stringMap[i], value)) {
		exec->index = target;
		if ((exec->callback != NULL) && (comp->transdata != NULL)) {
		    exec->callback(exec->data, value,
			  comp->transdata[state * comp->nbstrings + i], data);
		}
		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_SINK_STATE)
		    goto error;

		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_FINAL_STATE)
		    return(1);
		return(0);
	    }
	}
    }
    /*
     * Failed to find an exit transition out from current state for the
     * current token
     */
error:
    exec->errStateNo = state;
    exec->status = XML_REGEXP_NOT_FOUND;
    xmlRegExecSetErrString(exec, value);
    return(exec->status);
}